

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

QByteArray * QSslCertificatePrivate::subjectInfoToString(SubjectInfo info)

{
  char *pcVar1;
  QByteArray *in_RDI;
  
  switch(info) {
  case Organization:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "O";
    break;
  case CommonName:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "CN";
    goto LAB_001ce7d8;
  case LocalityName:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "L";
    break;
  case OrganizationalUnitName:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "OU";
    goto LAB_001ce7d8;
  case CountryName:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "C";
    break;
  case StateOrProvinceName:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "ST";
LAB_001ce7d8:
    (in_RDI->d).ptr = pcVar1;
    (in_RDI->d).size = 2;
    return in_RDI;
  case DistinguishedNameQualifier:
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = "dnQualifier";
    (in_RDI->d).size = 0xb;
    return in_RDI;
  case SerialNumber:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "serialNumber";
    goto LAB_001ce80e;
  case EmailAddress:
    (in_RDI->d).d = (Data *)0x0;
    pcVar1 = "emailAddress";
LAB_001ce80e:
    (in_RDI->d).ptr = pcVar1;
    (in_RDI->d).size = 0xc;
    return in_RDI;
  default:
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char *)0x0;
    (in_RDI->d).size = 0;
    return in_RDI;
  }
  (in_RDI->d).ptr = pcVar1;
  (in_RDI->d).size = 1;
  return in_RDI;
}

Assistant:

QByteArray QSslCertificatePrivate::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    switch (info) {
    case QSslCertificate::Organization: return "O"_ba;
    case QSslCertificate::CommonName: return "CN"_ba;
    case QSslCertificate::LocalityName: return"L"_ba;
    case QSslCertificate::OrganizationalUnitName: return "OU"_ba;
    case QSslCertificate::CountryName: return "C"_ba;
    case QSslCertificate::StateOrProvinceName: return "ST"_ba;
    case QSslCertificate::DistinguishedNameQualifier: return "dnQualifier"_ba;
    case QSslCertificate::SerialNumber: return "serialNumber"_ba;
    case QSslCertificate::EmailAddress: return "emailAddress"_ba;
    }
    return QByteArray();
}